

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_byte(lua_State *L)

{
  ulong in_RAX;
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  int space;
  ulong uVar4;
  size_t l;
  ulong local_38;
  
  local_38 = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&local_38);
  uVar2 = luaL_optinteger(L,2,1);
  uVar4 = uVar2;
  if (((long)uVar2 < 1) &&
     (uVar4 = 1, SBORROW8(uVar2,-local_38) == (long)(uVar2 + local_38) < 0 && uVar2 != 0)) {
    uVar4 = uVar2 + local_38 + 1;
  }
  uVar3 = luaL_optinteger(L,3,uVar2);
  uVar2 = local_38;
  if (((long)uVar3 <= (long)local_38) && (uVar2 = uVar3, (long)uVar3 < 0)) {
    if (SBORROW8(uVar3,-local_38) == (long)(uVar3 + local_38) < 0) {
      uVar2 = uVar3 + local_38 + 1;
    }
    else {
      uVar2 = 0;
    }
  }
  space = 0;
  if (uVar4 <= uVar2) {
    if (uVar2 - uVar4 < 0x7fffffff) {
      space = (int)(uVar2 - uVar4) + 1;
      luaL_checkstack(L,space,"string slice too long");
      uVar4 = uVar4 - 1;
      do {
        lua_pushinteger(L,(ulong)(byte)pcVar1[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer pi = luaL_optinteger(L, 2, 1);
  size_t posi = posrelatI(pi, l);
  size_t pose = getendpos(L, 3, pi, l);
  int n, i;
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (l_unlikely(pose - posi >= (size_t)INT_MAX))  /* arithmetic overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, cast_uchar(s[posi + cast_uint(i) - 1]));
  return n;
}